

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_range_cardinality
                   (roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  uint8_t typecode;
  container_t *c;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  uVar3 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar3 = range_end;
  }
  if (range_start < uVar3) {
    uVar3 = uVar3 - 1;
    uVar1 = ra_get_index(&r->high_low_container,(uint16_t)(range_start >> 0x10));
    if ((int)uVar1 < 0) {
      uVar1 = ~uVar1;
      uVar5 = 0;
    }
    else {
      c = (r->high_low_container).containers[uVar1];
      typecode = (r->high_low_container).typecodes[uVar1];
      if (range_start >> 0x10 == uVar3 >> 0x10) {
        iVar2 = container_rank(c,typecode,(uint16_t)uVar3);
      }
      else {
        iVar2 = container_get_cardinality(c,typecode);
      }
      uVar5 = (uint64_t)iVar2;
      if ((short)range_start != 0) {
        iVar2 = container_rank((r->high_low_container).containers[uVar1],
                               (r->high_low_container).typecodes[uVar1],(short)range_start - 1);
        uVar5 = uVar5 - (long)iVar2;
      }
      uVar1 = uVar1 + 1;
    }
    for (uVar6 = (ulong)uVar1; (int)uVar6 < (r->high_low_container).size; uVar6 = uVar6 + 1) {
      uVar4 = (uint)(uVar3 >> 0x10);
      uVar1 = (uint)(r->high_low_container).keys[uVar6];
      if (uVar4 <= uVar1) {
        if (uVar4 != uVar1) {
          return uVar5;
        }
        iVar2 = container_rank((r->high_low_container).containers[uVar6],
                               (r->high_low_container).typecodes[uVar6],(uint16_t)uVar3);
        return uVar5 + (long)iVar2;
      }
      iVar2 = container_get_cardinality
                        ((r->high_low_container).containers[uVar6],
                         (r->high_low_container).typecodes[uVar6]);
      uVar5 = uVar5 + (long)iVar2;
    }
  }
  else {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality(const roaring_bitmap_t *r,
                                          uint64_t range_start,
                                          uint64_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_end > UINT32_MAX) {
        range_end = UINT32_MAX + UINT64_C(1);
    }
    if (range_start >= range_end) {
        return 0;
    }
    range_end--;  // make range_end inclusive
    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}